

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memheap.cpp
# Opt level: O1

void * __thiscall CHeap::Allocate(CHeap *this,uint Size)

{
  char *pcVar1;
  CChunk *pCVar2;
  
  pCVar2 = this->m_pCurrent;
  pcVar1 = pCVar2->m_pCurrent;
  if (pCVar2->m_pEnd < pcVar1 + Size) {
    pcVar1 = (char *)0x0;
  }
  else {
    pCVar2->m_pCurrent = pcVar1 + Size;
  }
  if (pcVar1 == (char *)0x0) {
    pCVar2 = (CChunk *)mem_alloc(0x10020);
    if (pCVar2 != (CChunk *)0x0) {
      pCVar2->m_pMemory = (char *)(pCVar2 + 1);
      pCVar2->m_pCurrent = (char *)(pCVar2 + 1);
      pCVar2->m_pEnd = (char *)(pCVar2 + 0x801);
      pCVar2->m_pNext = this->m_pCurrent;
      this->m_pCurrent = pCVar2;
    }
    pCVar2 = this->m_pCurrent;
    pcVar1 = pCVar2->m_pCurrent;
    if (pCVar2->m_pEnd < pcVar1 + Size) {
      pcVar1 = (char *)0x0;
    }
    else {
      pCVar2->m_pCurrent = pcVar1 + Size;
    }
  }
  return pcVar1;
}

Assistant:

void *CHeap::Allocate(unsigned int Size)
{
	// try to allocate from current chunk
	char *pMem = (char *)AllocateFromChunk(Size);
	if(!pMem)
	{
		// allocate new chunk and add it to the heap
		NewChunk();

		// try to allocate again
		pMem = (char *)AllocateFromChunk(Size);
	}

	return pMem;
}